

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

Id dxil_spv::build_bindless_heap_offset_push_constant
             (Impl *impl,ResourceReference *reference,Value *dynamic_offset)

{
  undefined8 uVar1;
  StorageClass storageClass;
  Id IVar2;
  Builder *this;
  void *pvVar3;
  Operation *this_00;
  Operation *this_01;
  Operation *loaded_word;
  Operation *descriptor_table;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Builder *builder;
  Value *dynamic_offset_local;
  ResourceReference *reference_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  if (((reference->push_constant_member <
        impl->root_constant_num_words + impl->root_descriptor_count) &&
      (impl->root_descriptor_count <= reference->push_constant_member)) &&
     (impl->root_constant_id != 0)) {
    storageClass = StorageClassPushConstant;
    if (((impl->options).inline_ubo_enable & 1U) != 0) {
      storageClass = StorageClassUniform;
    }
    IVar2 = spv::Builder::makeUintType(this,0x20);
    IVar2 = spv::Builder::makePointer(this,storageClass,IVar2);
    this_00 = Converter::Impl::allocate(impl,OpAccessChain,IVar2);
    Operation::add_id(this_00,impl->root_constant_id);
    IVar2 = spv::Builder::makeUintConstant(this,reference->push_constant_member,false);
    Operation::add_id(this_00,IVar2);
    Converter::Impl::add(impl,this_00,false);
    IVar2 = spv::Builder::makeUintType(this,0x20);
    this_01 = Converter::Impl::allocate(impl,OpLoad,IVar2);
    Operation::add_id(this_01,this_00->id);
    Converter::Impl::add(impl,this_01,false);
    impl_local._4_4_ =
         build_bindless_heap_offset(impl,this_01->id,reference->base_offset,dynamic_offset);
  }
  else {
    buffer._4088_8_ = get_thread_log_callback();
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Descriptor table offset is out of push constant range.\n");
      fflush(_stderr);
    }
    else {
      snprintf((char *)&descriptor_table,0x1000,
               "Descriptor table offset is out of push constant range.\n");
      uVar1 = buffer._4088_8_;
      pvVar3 = get_thread_log_callback_userdata();
      (*(code *)uVar1)(pvVar3,2,&descriptor_table);
    }
    impl_local._4_4_ = 0;
  }
  return impl_local._4_4_;
}

Assistant:

static spv::Id build_bindless_heap_offset_push_constant(Converter::Impl &impl, const Converter::Impl::ResourceReference &reference,
                                                        const llvm::Value *dynamic_offset)
{
	auto &builder = impl.builder();
	if (reference.push_constant_member >= (impl.root_constant_num_words + impl.root_descriptor_count) ||
	    reference.push_constant_member < impl.root_descriptor_count ||
	    impl.root_constant_id == 0)
	{
		LOGE("Descriptor table offset is out of push constant range.\n");
		return 0;
	}

	auto *descriptor_table = impl.allocate(
		spv::OpAccessChain,
		builder.makePointer(impl.options.inline_ubo_enable ? spv::StorageClassUniform : spv::StorageClassPushConstant,
		                    builder.makeUintType(32)));
	descriptor_table->add_id(impl.root_constant_id);
	descriptor_table->add_id(builder.makeUintConstant(reference.push_constant_member));
	impl.add(descriptor_table);

	auto *loaded_word = impl.allocate(spv::OpLoad, builder.makeUintType(32));
	loaded_word->add_id(descriptor_table->id);
	impl.add(loaded_word);

	return build_bindless_heap_offset(impl, loaded_word->id, reference.base_offset, dynamic_offset);
}